

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::FastV32S1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  char cVar1;
  uint uVar2;
  uint *puVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  ParseContext *ctx_00;
  ushort *puVar7;
  
  if (data.field_0._0_1_ != '\0') {
    pcVar4 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar4;
  }
  uVar6 = (ulong)ptr[1];
  if ((long)uVar6 < 0) {
    uVar5 = (long)ptr[2] << 7 | 0x7f;
    if ((long)uVar5 < 0) {
      ctx_00 = (ParseContext *)((long)ptr[3] << 0xe | 0x3fff);
      if ((long)ctx_00 < 0) {
        uVar5 = ((long)ptr[4] << 0x15 | 0x1fffffU) & uVar5;
        if ((long)uVar5 < 0) {
          ctx_00 = (ParseContext *)(((long)ptr[5] << 0x1c | 0xfffffffU) & (ulong)ctx_00);
          if ((long)ctx_00 < 0) {
            if (ptr[6] < '\0') {
              if (ptr[7] < '\0') {
                if (ptr[8] < '\0') {
                  if (ptr[9] < '\0') {
                    cVar1 = ptr[10];
                    puVar7 = (ushort *)(ptr + 0xb);
                    if ((cVar1 != '\x01') && (cVar1 < '\0')) {
                      pcVar4 = Error(msg,(char *)CONCAT71((int7)((ulong)((long)ptr[2] << 7) >> 8),
                                                          cVar1),ctx_00,data,table,hasbits);
                      return pcVar4;
                    }
                  }
                  else {
                    puVar7 = (ushort *)(ptr + 10);
                  }
                }
                else {
                  puVar7 = (ushort *)(ptr + 9);
                }
              }
              else {
                puVar7 = (ushort *)(ptr + 8);
              }
            }
            else {
              puVar7 = (ushort *)(ptr + 7);
            }
          }
          else {
            puVar7 = (ushort *)(ptr + 6);
          }
        }
        else {
          puVar7 = (ushort *)(ptr + 5);
        }
      }
      else {
        puVar7 = (ushort *)(ptr + 4);
      }
      uVar5 = (ulong)ctx_00 & uVar5;
    }
    else {
      puVar7 = (ushort *)(ptr + 3);
    }
    uVar6 = uVar6 & uVar5;
  }
  else {
    puVar7 = (ushort *)(ptr + 2);
  }
  uVar5 = hasbits | 1L << ((ulong)data.field_0 >> 0x10 & 0x3f);
  puVar3 = RefAt<unsigned_int>(msg,(ulong)data.field_0 >> 0x30);
  *puVar3 = (uint)uVar6;
  if ((ctx->super_EpsCopyInputStream).limit_end_ <= puVar7) {
    if ((ulong)table->has_bits_offset != 0) {
      puVar3 = RefAt<unsigned_int>(msg,(ulong)table->has_bits_offset);
      *puVar3 = *puVar3 | (uint)uVar5;
    }
    return (char *)puVar7;
  }
  uVar2 = (uint)table->fast_idx_mask & (uint)*puVar7;
  if ((uVar2 & 7) == 0) {
    uVar6 = (ulong)(uVar2 & 0xfffffff8);
    pcVar4 = (char *)(**(code **)(&table[1].has_bits_offset + uVar6))
                               (msg,puVar7,ctx,
                                (ulong)*puVar7 ^ *(ulong *)(&table[1].fast_idx_mask + uVar6 * 2),
                                table,uVar5);
    return pcVar4;
  }
  protobuf_assumption_failed
            ("(idx & 7) == 0",
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
             ,0x452);
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastV32S1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return FastVarintS1<uint32_t>(PROTOBUF_TC_PARAM_PASS);
}